

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O1

String * __thiscall
Json::Reader::getLocationLineAndColumn_abi_cxx11_
          (String *__return_storage_ptr__,Reader *this,Location location)

{
  size_t sVar1;
  int column;
  int line;
  char buffer [51];
  uint local_60;
  uint local_5c;
  char local_58 [64];
  
  getLocationLineAndColumn(this,location,(int *)&local_5c,(int *)&local_60);
  snprintf(local_58,0x33,"Line %d, Column %d",(ulong)local_5c,(ulong)local_60);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(local_58);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_58,local_58 + sVar1);
  return __return_storage_ptr__;
}

Assistant:

String Reader::getLocationLineAndColumn(Location location) const {
  int line, column;
  getLocationLineAndColumn(location, line, column);
  char buffer[18 + 16 + 16 + 1];
  jsoncpp_snprintf(buffer, sizeof(buffer), "Line %d, Column %d", line, column);
  return buffer;
}